

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequencer.cpp
# Opt level: O1

void __thiscall egc::Sequencer::INCR(Sequencer *this,unsigned_short instruction)

{
  long lVar1;
  long lVar2;
  unsigned_short uVar3;
  uint uVar4;
  uint uVar5;
  ostream *poVar6;
  unsigned_short word;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"INCR",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 0x40;
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  lVar1 = *(long *)poVar6;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffffb5 | 2;
  std::ios::widen((char)*(undefined8 *)(lVar1 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  uVar3 = Memory::Read((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,instruction & 0x3ff,0);
  word = 1;
  if (uVar3 != 0x7fff) {
    uVar4 = (uint)uVar3;
    uVar5 = uVar4 + ((uVar4 + 1 & 0xffff) >> 0xf) + 1;
    uVar4 = uVar5 & 0x3fff | uVar4 & 0x4000;
    if ((uVar5 >> 0xe & 1) == 0) {
      uVar4 = uVar5;
    }
    if ((uVar3 & 0x4000) != 0) {
      uVar4 = uVar5;
    }
    word = (unsigned_short)(uVar4 & 0x7fff);
    if ((uVar4 & 0x7fff) == 0) {
      word = 0x7fff;
    }
  }
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                instruction & 0x3ff,word);
  return;
}

Assistant:

void egc::Sequencer::INCR (unsigned short instruction)
{
    unsigned short k = instruction & 001777u;

    std::cout << "INCR" << " " << std::oct << k << std::dec << std::endl;

    auto mk = m_Memory->Read(k);

    unsigned short sign = mk & 040000u;

    if (mk == 077777u)
    {
        mk = 000001u;
    }
    else
    {
        mk = AddWords(mk, 000001u).first;
    }

    m_Memory->Write(k, mk);
}